

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O0

void __thiscall
duckdb::MetadataManager::ConvertToTransient(MetadataManager *this,MetadataBlock *metadata_block)

{
  shared_ptr<duckdb::BlockHandle,_true> *this_00;
  shared_ptr<duckdb::BlockHandle,_true> *other;
  BlockManager *this_01;
  idx_t __n;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  shared_ptr<duckdb::BlockHandle,_true> new_block;
  BufferHandle new_buffer;
  BufferHandle old_buffer;
  shared_ptr<duckdb::BlockHandle,_true> *in_stack_ffffffffffffff78;
  shared_ptr<duckdb::BlockHandle,_true> *in_stack_ffffffffffffff80;
  BlockManager *in_stack_ffffffffffffffa0;
  BufferHandle local_40;
  undefined1 local_28 [40];
  
  (**(code **)(*(long *)in_RDI[1] + 0x38))(local_28,(long *)in_RDI[1],in_RSI);
  (**(code **)(*(long *)in_RDI[1] + 0x28))(&local_40,(long *)in_RDI[1],7,*in_RDI,0);
  this_00 = BufferHandle::GetBlockHandle(&local_40);
  shared_ptr<duckdb::BlockHandle,_true>::shared_ptr
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  other = (shared_ptr<duckdb::BlockHandle,_true> *)BufferHandle::Ptr((BufferHandle *)0xabfd68);
  this_01 = (BlockManager *)BufferHandle::Ptr((BufferHandle *)0xabfd79);
  __n = BlockManager::GetBlockSize(this_01);
  memcpy(other,this_01,__n);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(this_00,other);
  BlockManager::UnregisterBlock(in_stack_ffffffffffffffa0,(block_id_t)in_RDI);
  shared_ptr<duckdb::BlockHandle,_true>::~shared_ptr
            ((shared_ptr<duckdb::BlockHandle,_true> *)0xabfdd7);
  BufferHandle::~BufferHandle((BufferHandle *)this_01);
  BufferHandle::~BufferHandle((BufferHandle *)this_01);
  return;
}

Assistant:

void MetadataManager::ConvertToTransient(MetadataBlock &metadata_block) {
	// pin the old block
	auto old_buffer = buffer_manager.Pin(metadata_block.block);

	// allocate a new transient block to replace it
	auto new_buffer = buffer_manager.Allocate(MemoryTag::METADATA, &block_manager, false);
	auto new_block = new_buffer.GetBlockHandle();

	// copy the data to the transient block
	memcpy(new_buffer.Ptr(), old_buffer.Ptr(), block_manager.GetBlockSize());
	metadata_block.block = std::move(new_block);

	// unregister the old block
	block_manager.UnregisterBlock(metadata_block.block_id);
}